

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

void __thiscall
CGraphics_Threaded::SetColorVertex(CGraphics_Threaded *this,CColorVertex *pArray,int Num)

{
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  int i;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_18;
  
  dbg_assert_imp(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,(char *)0x12f7c7);
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    *(undefined4 *)(in_RDI + (long)*(int *)(in_RSI + (long)local_18 * 0x14) * 0x10 + 0x1200a4) =
         *(undefined4 *)(in_RSI + (long)local_18 * 0x14 + 4);
    *(undefined4 *)(in_RDI + (long)*(int *)(in_RSI + (long)local_18 * 0x14) * 0x10 + 0x1200a8) =
         *(undefined4 *)(in_RSI + (long)local_18 * 0x14 + 8);
    *(undefined4 *)(in_RDI + (long)*(int *)(in_RSI + (long)local_18 * 0x14) * 0x10 + 0x1200ac) =
         *(undefined4 *)(in_RSI + (long)local_18 * 0x14 + 0xc);
    *(undefined4 *)(in_RDI + (long)*(int *)(in_RSI + (long)local_18 * 0x14) * 0x10 + 0x1200b0) =
         *(undefined4 *)(in_RSI + (long)local_18 * 0x14 + 0x10);
  }
  return;
}

Assistant:

void CGraphics_Threaded::SetColorVertex(const CColorVertex *pArray, int Num)
{
	dbg_assert(m_Drawing != 0, "called Graphics()->SetColorVertex without begin");

	for(int i = 0; i < Num; ++i)
	{
		m_aColor[pArray[i].m_Index].r = pArray[i].m_R;
		m_aColor[pArray[i].m_Index].g = pArray[i].m_G;
		m_aColor[pArray[i].m_Index].b = pArray[i].m_B;
		m_aColor[pArray[i].m_Index].a = pArray[i].m_A;
	}
}